

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

void __thiscall
andres::
BinaryViewExpression<andres::BinaryViewExpression<andres::BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Times<short,_short,_short>_>,_short,_andres::BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_int,_andres::marray_detail::Times<int,_short,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Minus<short,_int,_int>_>,_int,_andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
::BinaryViewExpression
          (BinaryViewExpression<andres::BinaryViewExpression<andres::BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Times<short,_short,_short>_>,_short,_andres::BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_int,_andres::marray_detail::Times<int,_short,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Minus<short,_int,_int>_>,_int,_andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
           *this,ViewExpression<andres::BinaryViewExpression<andres::BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Times<short,_short,_short>_>,_short,_andres::BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_int,_andres::marray_detail::Times<int,_short,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Minus<short,_int,_int>_>,_int>
                 *e1,
          ViewExpression<andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int>
          *e2)

{
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  runtime_error *this_00;
  ulong uVar6;
  
  this->e1_ = (expression_type_1 *)e1;
  this->e2_ = (expression_type_2 *)e2;
  uVar1 = *(ulong *)(**(long **)e1 + 0x30);
  uVar2 = *(ulong *)((*(long **)e1)[1] + 0x30);
  if (uVar2 < uVar1) {
    uVar2 = uVar1;
  }
  uVar1 = *(ulong *)(*(long *)**(undefined8 **)(e1 + 8) + 0x30);
  uVar6 = *(ulong *)((*(undefined8 **)(e1 + 8))[1] + 0x30);
  if (uVar6 < uVar1) {
    uVar6 = uVar1;
  }
  if ((uVar6 == 0 && uVar2 == 0) ||
     (*(long *)(*(long *)(e2 + 8) + 0x30) == 0 && *(long *)(*(long *)e2 + 0x30) == 0)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
  else {
    sVar3 = BinaryViewExpression<andres::BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Times<short,_short,_short>_>,_short,_andres::BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_int,_andres::marray_detail::Times<int,_short,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Minus<short,_int,_int>_>
            ::dimension((BinaryViewExpression<andres::BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Times<short,_short,_short>_>,_short,_andres::BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_int,_andres::marray_detail::Times<int,_short,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Minus<short,_int,_int>_>
                         *)e1);
    sVar4 = BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
            ::dimension(this->e2_);
    if (sVar3 == sVar4) {
      sVar3 = BinaryViewExpression<andres::BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Times<short,_short,_short>_>,_short,_andres::BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_int,_andres::marray_detail::Times<int,_short,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Minus<short,_int,_int>_>
              ::dimension(this->e1_);
      if (sVar3 != 0) {
        sVar3 = 0;
        do {
          sVar4 = BinaryViewExpression<andres::BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Times<short,_short,_short>_>,_short,_andres::BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_int,_andres::marray_detail::Times<int,_short,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Minus<short,_int,_int>_>
                  ::shape(this->e1_,sVar3);
          sVar5 = BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
                  ::shape(this->e2_,sVar3);
          if (sVar4 != sVar5) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"Assertion failed.");
            goto LAB_0022320f;
          }
          sVar3 = sVar3 + 1;
          sVar4 = BinaryViewExpression<andres::BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Times<short,_short,_short>_>,_short,_andres::BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_int,_andres::marray_detail::Times<int,_short,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Minus<short,_int,_int>_>
                  ::dimension(this->e1_);
        } while (sVar3 < sVar4);
      }
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
LAB_0022320f:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

BinaryViewExpression(const ViewExpression<E1, T1>& e1, 
        const ViewExpression<E2, T2>& e2) 
        : e1_(e1), e2_(e2), // cast!
          binaryFunctor_(BinaryFunctor()) 
        {
            if(!MARRAY_NO_DEBUG) {
                marray_detail::Assert(e1_.size() != 0 && e2_.size() != 0);
                marray_detail::Assert(e1_.dimension() == e2_.dimension());
                for(std::size_t j=0; j<e1_.dimension(); ++j) {
                    marray_detail::Assert(e1_.shape(j) == e2_.shape(j));
                }
            }
        }